

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

ssize_t __thiscall
duckdb_parquet::DictionaryPageHeader::write
          (DictionaryPageHeader *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_EAX;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar7;
  int iVar8;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"DictionaryPageHeader");
  uVar7 = CONCAT44(iVar1,in_EAX);
  iVar1 = (*this_00->_vptr_TProtocol[6])(this_00,"num_values",8,1,in_R8,in_R9,uVar7);
  iVar8 = (int)((ulong)uVar7 >> 0x20);
  iVar2 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)(uint)this->num_values);
  iVar3 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar4 = (*this_00->_vptr_TProtocol[6])(this_00,"encoding",8,2);
  iVar5 = (*this_00->_vptr_TProtocol[0x12])(this_00,(ulong)this->encoding);
  iVar6 = (*this_00->_vptr_TProtocol[7])(this_00);
  iVar1 = iVar4 + iVar5 + iVar6 + iVar2 + iVar3 + iVar1 + iVar8;
  if (((byte)this->__isset & 1) != 0) {
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"is_sorted",2,3);
    iVar3 = (*this_00->_vptr_TProtocol[0xf])(this_00,(ulong)this->is_sorted);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = iVar3 + iVar4 + iVar2 + iVar1;
  }
  iVar2 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar2 + iVar1 + iVar3);
}

Assistant:

uint32_t DictionaryPageHeader::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("DictionaryPageHeader");

  xfer += oprot->writeFieldBegin("num_values", ::apache::thrift::protocol::T_I32, 1);
  xfer += oprot->writeI32(this->num_values);
  xfer += oprot->writeFieldEnd();

  xfer += oprot->writeFieldBegin("encoding", ::apache::thrift::protocol::T_I32, 2);
  xfer += oprot->writeI32(static_cast<int32_t>(this->encoding));
  xfer += oprot->writeFieldEnd();

  if (this->__isset.is_sorted) {
    xfer += oprot->writeFieldBegin("is_sorted", ::apache::thrift::protocol::T_BOOL, 3);
    xfer += oprot->writeBool(this->is_sorted);
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}